

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixFixSize.h
# Opt level: O0

void __thiscall
iDynTree::MatrixFixSize<4U,_4U>::MatrixFixSize
          (MatrixFixSize<4U,_4U> *this,MatrixView<const_double> *other)

{
  index_type iVar1;
  reference peVar2;
  size_t sVar3;
  MatrixView<const_double> *in_RSI;
  MatrixFixSize<4U,_4U> *in_RDI;
  size_t col;
  size_t row;
  element_type in_stack_ffffffffffffffc0;
  MatrixView<const_double> *this_00;
  MatrixFixSize<4U,_4U> *in_stack_ffffffffffffffe0;
  ulong col_00;
  ulong local_18;
  
  this_00 = in_RSI;
  iVar1 = MatrixView<const_double>::rows(in_RSI);
  if ((iVar1 == 4) && (iVar1 = MatrixView<const_double>::cols(this_00), iVar1 == 4)) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      for (col_00 = 0; col_00 < 4; col_00 = col_00 + 1) {
        peVar2 = MatrixView<const_double>::operator()
                           (this_00,(index_type)in_RSI,(index_type)in_stack_ffffffffffffffc0);
        in_stack_ffffffffffffffc0 = *peVar2;
        sVar3 = rawIndexRowMajor(in_RDI,local_18,col_00);
        in_RDI->m_data[sVar3] = in_stack_ffffffffffffffc0;
      }
    }
  }
  else {
    iDynTree::reportError("MatrixFixSize","constructor","input matrix does not have the right size")
    ;
    zero(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

MatrixFixSize<nRows,nCols>::MatrixFixSize(iDynTree::MatrixView<const double> other)
    {
        if( other.rows() != nRows ||
            other.cols() != nCols )
        {
            reportError("MatrixFixSize","constructor","input matrix does not have the right size");
            this->zero();
        }
        else
        {
            for(std::size_t row=0; row < nRows; row++ )
            {
                for(std::size_t col=0; col < nCols; col++ )
                {
                    this->m_data[rawIndexRowMajor(row,col)] = other(row, col);
                }
            }
        }
    }